

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::~EnumGenerator(EnumGenerator *this)

{
  EnumGenerator *this_local;
  
  std::
  vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ::~vector(&this->aliases_);
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~vector(&this->canonical_values_);
  return;
}

Assistant:

EnumGenerator::~EnumGenerator() {}